

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtb.cc
# Opt level: O3

ssize_t anon_unknown.dwarf_1aa38::write(int __fd,void *__buf,size_t __n)

{
  int *in_RAX;
  size_t __n_00;
  void *__buf_00;
  undefined4 in_register_0000003c;
  ulong uVar1;
  size_t __n_01;
  void *__buf_01;
  
  __buf_01 = (void *)CONCAT44(in_register_0000003c,__fd);
  __n_01 = (long)__buf - (long)__buf_01;
  do {
    while( true ) {
      if (__n_01 == 0) {
        return (ssize_t)in_RAX;
      }
      uVar1 = __n & 0xffffffff;
      __buf_00 = __buf_01;
      in_RAX = (int *)::write((int)__n,__buf_01,__n_01);
      if ((long)in_RAX < 0) break;
      __buf_01 = (void *)((long)__buf_01 + (long)in_RAX);
      __n_01 = __n_01 - (long)in_RAX;
    }
    in_RAX = __errno_location();
  } while (*in_RAX == 0xb);
  _GLOBAL__N_1::write((int)uVar1,__buf_00,__n_00);
  return (ulong)(uint)(*(int *)(uVar1 + 0x10) - *(int *)(uVar1 + 8));
}

Assistant:

void write(dtc::byte_buffer &buffer, int fd)
{
	size_t size = buffer.size();
	uint8_t *data = buffer.data();
	while (size > 0)
	{
		ssize_t r = ::write(fd, data, size);
		if (r >= 0)
		{
			data += r;
			size -= r;
		}
		else if (errno != EAGAIN)
		{
			fprintf(stderr, "Writing to file failed\n");
			exit(-1);
		}
	}
}